

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O3

int Psr_ManReadSignal(Psr_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  int Entry;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint Value;
  byte *pbVar7;
  ulong extraout_RDX;
  byte *pbVar8;
  ulong extraout_RDX_00;
  Vec_Int_t *p_00;
  byte *pbVar9;
  char *pError;
  undefined4 uVar10;
  undefined4 uVar11;
  
  pbVar8 = (byte *)p->pLimit;
  pbVar9 = (byte *)p->pCur;
  if (pbVar9 < pbVar8) {
LAB_00331b14:
    bVar6 = *pbVar9;
    uVar5 = (ulong)bVar6;
    if (uVar5 < 0x30) {
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0) {
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
        goto LAB_00331b14;
      }
      if (uVar5 != 0x2f) {
        if (uVar5 != 0) goto LAB_00331bab;
        goto LAB_00331e21;
      }
      if (pbVar9[1] != 0x2a) {
        if (pbVar9[1] == 0x2f) {
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar8 <= pbVar9) goto LAB_00331ba9;
          while (bVar6 = *pbVar9, pbVar9 = pbVar9 + 1, bVar6 != 10) {
            p->pCur = (char *)pbVar9;
            if (pbVar9 == pbVar8) goto LAB_00331ba9;
          }
          goto LAB_00331b97;
        }
        bVar6 = 0x2f;
        goto LAB_00331ef2;
      }
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar8 <= pbVar9) {
LAB_00331ba9:
        bVar6 = *pbVar9;
        goto LAB_00331bab;
      }
      while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar8) goto LAB_00331ba9;
      }
      pbVar9 = pbVar9 + 2;
LAB_00331b97:
      p->pCur = (char *)pbVar9;
      if (pbVar8 <= pbVar9) goto LAB_00331e21;
      goto LAB_00331b14;
    }
LAB_00331bab:
    if ((byte)(bVar6 - 0x3a) < 0xf6) {
      if (bVar6 == 0x5c) {
        pbVar9 = pbVar9 + 1;
        pbVar8 = pbVar9;
        do {
          p->pCur = (char *)pbVar8;
          bVar6 = *pbVar8;
          pbVar8 = pbVar8 + 1;
        } while (bVar6 != 0x20);
      }
      else {
        if (bVar6 == 0x7b) {
          if (p->fUsingTemp2 != 0) {
            if (p->ErrorStr[0] == '\0') {
              builtin_strncpy(p->ErrorStr,"Cannot read nested concatenations.",0x23);
              return 0;
            }
            goto LAB_003322c9;
          }
          p->fUsingTemp2 = 1;
          if (*pbVar9 != 0x7b) {
            __assert_fail("Psr_ManIsChar(p, \'{\')",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                          ,0x192,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
          }
          p->pCur = (char *)(pbVar9 + 1);
          iVar2 = Psr_ManReadSignalList(p,&p->vTemp2,'}',0);
          Value = (uint)extraout_RDX;
          if (iVar2 == 0) {
            Psr_ManErrorSet(p,"Error number 7.",Value);
            p->fUsingTemp2 = 0;
            Value = extraout_EDX_01;
LAB_00332057:
            pError = "Error number 11.";
            goto LAB_00332270;
          }
          if (*p->pCur != '}') {
            __assert_fail("Psr_ManIsChar(p, \'}\')",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                          ,0x196,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
          }
          pbVar9 = (byte *)(p->pCur + 1);
          p->pCur = (char *)pbVar9;
          iVar2 = (p->vTemp2).nSize;
          if (iVar2 < 1) {
            __assert_fail("Vec_IntSize(vTemp2) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                          ,0x199,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
          }
          if (iVar2 == 1) {
            iVar2 = *(p->vTemp2).pArray;
            p->fUsingTemp2 = 0;
            uVar5 = extraout_RDX;
            if (iVar2 == 0) goto LAB_00332057;
          }
          else {
            iVar2 = Psr_NtkAddConcat(p->pNtk,&p->vTemp2);
            iVar2 = iVar2 * 4 + 3;
            p->fUsingTemp2 = 0;
            pbVar9 = (byte *)p->pCur;
            uVar5 = extraout_RDX_00;
          }
          pbVar8 = (byte *)p->pLimit;
          goto LAB_00332088;
        }
LAB_00331ef2:
        if ((bVar6 != 0x5f) && ((byte)((bVar6 & 0xdf) + 0xa5) < 0xe6)) goto LAB_00331fe0;
        pbVar8 = pbVar9 + 1;
        do {
          do {
            p->pCur = (char *)pbVar8;
            bVar6 = *pbVar8;
            pbVar8 = pbVar8 + 1;
          } while (0xf5 < (byte)(bVar6 - 0x3a));
        } while (((bVar6 == 0x24) || (bVar6 == 0x5f)) || (0xe5 < (byte)((bVar6 & 0xdf) + 0xa5)));
      }
      iVar2 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar9,(char *)(pbVar8 + -1),(int *)0x0);
      if (iVar2 == 0) {
LAB_00331fe0:
        if (p->ErrorStr[0] == '\0') {
          uVar11._0_1_ = ' ';
          uVar11._1_1_ = '1';
          uVar11._2_1_ = '3';
          uVar11._3_1_ = '.';
          goto LAB_0033221f;
        }
        goto LAB_003322c9;
      }
      pbVar8 = (byte *)p->pLimit;
      pbVar9 = (byte *)p->pCur;
      do {
        if (pbVar8 <= pbVar9) {
LAB_003321d5:
          if (p->ErrorStr[0] == '\0') {
            builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
            if (p->ErrorStr[0] == '\0') {
              uVar11._0_1_ = ' ';
              uVar11._1_1_ = '1';
              uVar11._2_1_ = '4';
              uVar11._3_1_ = '.';
LAB_0033221f:
              p->ErrorStr[0] = 'E';
              p->ErrorStr[1] = 'r';
              p->ErrorStr[2] = 'r';
              p->ErrorStr[3] = 'o';
              p->ErrorStr[4] = 'r';
              p->ErrorStr[5] = ' ';
              p->ErrorStr[6] = 'n';
              p->ErrorStr[7] = 'u';
              p->ErrorStr[8] = 'm';
              p->ErrorStr[9] = 'b';
              p->ErrorStr[10] = 'e';
              p->ErrorStr[0xb] = 'r';
              *(undefined4 *)(p->ErrorStr + 0xc) = uVar11;
              p->ErrorStr[0x10] = '\0';
              return 0;
            }
          }
          goto LAB_003322c9;
        }
        while( true ) {
          bVar6 = *pbVar9;
          uVar5 = (ulong)bVar6;
          if (0x2f < uVar5) goto LAB_00332002;
          if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
          pbVar9 = pbVar9 + 1;
          p->pCur = (char *)pbVar9;
        }
        if (uVar5 != 0x2f) {
          if (uVar5 != 0) {
LAB_00332002:
            if (bVar6 != 0x5b) {
LAB_00332036:
              return iVar2 << 2;
            }
            Entry = Psr_ManReadRange(p);
            if (Entry == 0) {
              pError = "Error number 15.";
              Value = extraout_EDX;
            }
            else {
              iVar3 = Psr_ManUtilSkipSpaces(p);
              if (iVar3 == 0) {
                iVar3 = (p->pNtk->vSlices).nSize;
                p_00 = &p->pNtk->vSlices;
                Vec_IntPush(p_00,iVar2);
                Vec_IntPush(p_00,Entry);
                return iVar3 * 4 + 1;
              }
              pError = "Error number 16.";
              Value = extraout_EDX_00;
            }
            goto LAB_00332270;
          }
          goto LAB_003321d5;
        }
        if (pbVar9[1] == 0x2a) {
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar8 <= pbVar9) {
LAB_00332000:
            bVar6 = *pbVar9;
            goto LAB_00332002;
          }
          while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
            pbVar9 = pbVar9 + 1;
            p->pCur = (char *)pbVar9;
            if (pbVar9 == pbVar8) goto LAB_00332000;
          }
          pbVar9 = pbVar9 + 2;
        }
        else {
          if (pbVar9[1] != 0x2f) goto LAB_00332036;
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar8 <= pbVar9) goto LAB_00332000;
          while (bVar6 = *pbVar9, pbVar9 = pbVar9 + 1, bVar6 != 10) {
            p->pCur = (char *)pbVar9;
            if (pbVar9 == pbVar8) goto LAB_00332000;
          }
        }
        p->pCur = (char *)pbVar9;
      } while( true );
    }
    pbVar8 = pbVar9 + 1;
    do {
      pbVar7 = pbVar8;
      p->pCur = (char *)pbVar7;
      pbVar8 = pbVar7 + 1;
    } while (0xf5 < (byte)(*pbVar7 - 0x3a));
    if (*pbVar7 != 0x27) {
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Cannot read constant.",0x16);
      }
      goto LAB_003322c9;
    }
    p->pCur = (char *)pbVar8;
    bVar6 = *pbVar8;
    if (bVar6 == 0x68) {
      p->pCur = (char *)(pbVar7 + 2);
      puVar1 = &p->pNtk->field_0x4;
      *puVar1 = *puVar1 | 4;
      pbVar7 = (byte *)p->pCur;
      bVar6 = *pbVar7;
      while ((0xf5 < (byte)(bVar6 - 0x3a) || (0xf9 < (byte)((bVar6 & 0xdf) + 0xb9)))) {
        pbVar8 = pbVar7;
        if (bVar6 != 0x30) {
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | 8;
          pbVar8 = (byte *)p->pCur;
        }
        pbVar7 = pbVar8 + 1;
        p->pCur = (char *)pbVar7;
        bVar6 = pbVar8[1];
      }
    }
    else {
      if (bVar6 != 100) {
        if (bVar6 != 0x62) {
          if (p->ErrorStr[0] == '\0') {
            builtin_strncpy(p->ErrorStr,"Cannot read radix of constant.",0x1f);
          }
          goto LAB_003322c9;
        }
        do {
          pbVar7 = pbVar8 + 1;
          p->pCur = (char *)pbVar7;
          bVar6 = pbVar8[1];
          if (bVar6 < 0x78) {
            bVar4 = 4;
            if (bVar6 != 0x30) {
              if (bVar6 != 0x31) goto LAB_00331ce9;
              bVar4 = 8;
            }
          }
          else if (bVar6 == 0x78) {
            bVar4 = 0x10;
          }
          else {
            if (bVar6 != 0x7a) goto LAB_00331ce9;
            bVar4 = 0x20;
          }
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | bVar4;
          pbVar8 = (byte *)p->pCur;
        } while( true );
      }
      p->pCur = (char *)(pbVar7 + 2);
      puVar1 = &p->pNtk->field_0x4;
      *puVar1 = *puVar1 | 4;
      bVar6 = *p->pCur;
      pbVar7 = (byte *)p->pCur;
      while (0xf5 < (byte)(bVar6 - 0x3a)) {
        if (bVar6 != 0x30) {
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | 8;
          pbVar7 = (byte *)p->pCur;
        }
        p->pCur = (char *)(pbVar7 + 1);
        bVar6 = pbVar7[1];
        pbVar7 = pbVar7 + 1;
      }
    }
LAB_00331ce9:
    iVar2 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar9,(char *)pbVar7,(int *)0x0);
    if (iVar2 == 0) {
      if (p->ErrorStr[0] != '\0') goto LAB_003322c9;
      uVar10._0_1_ = ' ';
      uVar10._1_1_ = '9';
      uVar10._2_1_ = '.';
      uVar10._3_1_ = '\0';
      goto LAB_00331e6b;
    }
    pbVar9 = (byte *)p->pLimit;
    pbVar8 = (byte *)p->pCur;
    do {
      if (pbVar9 <= pbVar8) {
LAB_00332140:
        if (p->ErrorStr[0] == '\0') {
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          if (p->ErrorStr[0] != '\0') goto LAB_003322c9;
          uVar11._0_1_ = ' ';
          uVar11._1_1_ = '1';
          uVar11._2_1_ = '0';
          uVar11._3_1_ = '.';
          goto LAB_0033221f;
        }
        goto LAB_003322c9;
      }
      while( true ) {
        uVar5 = (ulong)*pbVar8;
        if (0x2f < uVar5) goto LAB_0033218f;
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
        pbVar8 = pbVar8 + 1;
        p->pCur = (char *)pbVar8;
      }
      if (uVar5 != 0x2f) {
        if (uVar5 != 0) goto LAB_0033218f;
        goto LAB_00332140;
      }
      if (pbVar8[1] == 0x2a) {
        pbVar8 = pbVar8 + 2;
        p->pCur = (char *)pbVar8;
        if (pbVar9 <= pbVar8) goto LAB_0033218f;
        while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
          pbVar8 = pbVar8 + 1;
          p->pCur = (char *)pbVar8;
          if (pbVar8 == pbVar9) goto LAB_0033218f;
        }
        pbVar8 = pbVar8 + 2;
      }
      else {
        if (pbVar8[1] != 0x2f) {
LAB_0033218f:
          return iVar2 * 4 + 2;
        }
        pbVar8 = pbVar8 + 2;
        p->pCur = (char *)pbVar8;
        if (pbVar9 <= pbVar8) goto LAB_0033218f;
        while (*pbVar8 != 10) {
          pbVar8 = pbVar8 + 1;
          p->pCur = (char *)pbVar8;
          if (pbVar8 == pbVar9) goto LAB_0033218f;
        }
        pbVar8 = pbVar8 + 1;
      }
      p->pCur = (char *)pbVar8;
    } while( true );
  }
LAB_00331e21:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      uVar10._0_1_ = ' ';
      uVar10._1_1_ = '8';
      uVar10._2_1_ = '.';
      uVar10._3_1_ = '\0';
LAB_00331e6b:
      p->ErrorStr[0] = 'E';
      p->ErrorStr[1] = 'r';
      p->ErrorStr[2] = 'r';
      p->ErrorStr[3] = 'o';
      p->ErrorStr[4] = 'r';
      p->ErrorStr[5] = ' ';
      p->ErrorStr[6] = 'n';
      p->ErrorStr[7] = 'u';
      p->ErrorStr[8] = 'm';
      p->ErrorStr[9] = 'b';
      p->ErrorStr[10] = 'e';
      p->ErrorStr[0xb] = 'r';
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar10;
      return 0;
    }
  }
LAB_003322c9:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacPrs.h"
                ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
LAB_00332088:
  Value = (uint)uVar5;
  if (pbVar8 <= pbVar9) goto LAB_0033223a;
  while( true ) {
    uVar5 = (ulong)*pbVar9;
    Value = (uint)*pbVar9;
    if (0x2f < uVar5) {
      return iVar2;
    }
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
    pbVar9 = pbVar9 + 1;
    p->pCur = (char *)pbVar9;
  }
  if (uVar5 != 0x2f) {
    if (uVar5 != 0) {
      return iVar2;
    }
    goto LAB_0033223a;
  }
  bVar6 = pbVar9[1];
  uVar5 = (ulong)bVar6;
  if (bVar6 == 0x2a) {
    pbVar9 = pbVar9 + 2;
    p->pCur = (char *)pbVar9;
    if (pbVar8 <= pbVar9) {
      return iVar2;
    }
    while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
      pbVar9 = pbVar9 + 1;
      p->pCur = (char *)pbVar9;
      if (pbVar9 == pbVar8) {
        return iVar2;
      }
    }
    pbVar9 = pbVar9 + 2;
  }
  else {
    if (bVar6 != 0x2f) {
      return iVar2;
    }
    pbVar9 = pbVar9 + 2;
    p->pCur = (char *)pbVar9;
    if (pbVar8 <= pbVar9) {
      return iVar2;
    }
    while (*pbVar9 != 10) {
      pbVar9 = pbVar9 + 1;
      p->pCur = (char *)pbVar9;
      if (pbVar9 == pbVar8) {
        return iVar2;
      }
    }
    pbVar9 = pbVar9 + 1;
  }
  p->pCur = (char *)pbVar9;
  goto LAB_00332088;
LAB_0033223a:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    pError = "Error number 12.";
LAB_00332270:
    Psr_ManErrorSet(p,pError,Value);
    return 0;
  }
  goto LAB_003322c9;
}

Assistant:

static inline int Psr_ManReadSignal( Psr_Man_t * p )
{
    int Item;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 8.", 0);
    if ( Psr_ManIsDigit(p) )
    {
        Item = Psr_ManReadConstant(p);
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 9.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 10.", 0);
        return Abc_Var2Lit2( Item, BAC_PRS_CONST );
    }
    if ( Psr_ManIsChar(p, '{') )
    {
        if ( p->fUsingTemp2 )               return Psr_ManErrorSet(p, "Cannot read nested concatenations.", 0);
        p->fUsingTemp2 = 1;
        Item = Psr_ManReadConcat(p, &p->vTemp2);
        p->fUsingTemp2 = 0;
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 11.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 12.", 0);
        return Item;
    }
    else
    {
        Item = Psr_ManReadName( p );
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 13.", 0);    // was        return 1;                
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 14.", 0);
        if ( Psr_ManIsChar(p, '[') )
        {
            int Range = Psr_ManReadRange(p);
            if ( Range == 0 )               return Psr_ManErrorSet(p, "Error number 15.", 0);
            if ( Psr_ManUtilSkipSpaces(p) ) return Psr_ManErrorSet(p, "Error number 16.", 0);
            return Abc_Var2Lit2( Psr_NtkAddSlice(p->pNtk, Item, Range), BAC_PRS_SLICE );
        }
        return Abc_Var2Lit2( Item, BAC_PRS_NAME );
    }
}